

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpFactory.cpp
# Opt level: O0

ChildOp * __thiscall xercesc_4_0::OpFactory::createQuestionOp(OpFactory *this,bool nonGreedy)

{
  ChildOp *this_00;
  ChildOp *tmpOp;
  bool nonGreedy_local;
  OpFactory *this_local;
  
  this_00 = (ChildOp *)XMemory::operator_new(0x28,this->fMemoryManager);
  ChildOp::ChildOp(this_00,(nonGreedy & 1) + O_QUESTION,this->fMemoryManager);
  BaseRefVectorOf<xercesc_4_0::Op>::addElement
            (&this->fOpVector->super_BaseRefVectorOf<xercesc_4_0::Op>,(Op *)this_00);
  return this_00;
}

Assistant:

ChildOp* OpFactory::createQuestionOp(bool nonGreedy) {

    ChildOp* tmpOp = new (fMemoryManager)  ChildOp(nonGreedy ? Op::O_NONGREEDYQUESTION :
                                             Op::O_QUESTION, fMemoryManager);

    fOpVector->addElement(tmpOp);
    return tmpOp;
}